

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

optional<slang::TimeScale> __thiscall slang::ast::Scope::getTimeScale(Scope *this)

{
  SymbolKind SVar1;
  undefined4 uVar2;
  Symbol *pSVar3;
  bool bVar4;
  ulong in_RAX;
  Scope *pSVar5;
  Scope *current;
  
  pSVar5 = this;
  do {
    pSVar3 = pSVar5->thisSym;
    SVar1 = pSVar3->kind;
    if (SVar1 == Package) {
      SVar1 = pSVar3[2].kind;
      uVar2 = *(undefined4 *)&pSVar3[2].field_0x4;
LAB_002e90c9:
      in_RAX = CONCAT44(uVar2,SVar1);
LAB_002e90d0:
      bVar4 = false;
    }
    else {
      if (SVar1 == InstanceBody) {
        in_RAX = (ulong)*(uint5 *)(pSVar3[2].name._M_str + 0x55);
        goto LAB_002e90d0;
      }
      if (SVar1 == CompilationUnit) {
        SVar1 = *(SymbolKind *)&pSVar3[1].originatingSyntax;
        uVar2 = *(undefined4 *)((long)&pSVar3[1].originatingSyntax + 4);
        goto LAB_002e90c9;
      }
      pSVar5 = pSVar3->parentScope;
      bVar4 = true;
    }
    if (!bVar4) goto LAB_002e90f3;
  } while (pSVar5 != (Scope *)0x0);
  in_RAX = *(ulong *)&(this->compilation->options).defaultTimeScale;
LAB_002e90f3:
  return (optional<slang::TimeScale>)SUB85(in_RAX,0);
}

Assistant:

std::optional<TimeScale> Scope::getTimeScale() const {
    const Scope* current = this;
    do {
        auto& sym = current->asSymbol();
        switch (sym.kind) {
            case SymbolKind::CompilationUnit:
                return sym.as<CompilationUnitSymbol>().timeScale;
            case SymbolKind::Package:
                return sym.as<PackageSymbol>().timeScale;
            case SymbolKind::InstanceBody:
                return sym.as<InstanceBodySymbol>().getDefinition().timeScale;
            default:
                current = sym.getParentScope();
                break;
        }
    } while (current);

    return getCompilation().getDefaultTimeScale();
}